

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileImporter.cpp
# Opt level: O1

void __thiscall
Assimp::XFileImporter::InternReadFile
          (XFileImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  vector<char,_std::allocator<char>_> *this_00;
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  long *plVar3;
  runtime_error *prVar4;
  uint **ppuVar5;
  XFileParser parser;
  undefined1 local_88 [16];
  uint *local_78;
  char *pcStack_70;
  Scene *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_88._0_8_ = &local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"rb","");
  iVar1 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_88._0_8_);
  plVar3 = (long *)CONCAT44(extraout_var,iVar1);
  if ((uint **)local_88._0_8_ != &local_78) {
    operator_delete((void *)local_88._0_8_);
  }
  if (plVar3 == (long *)0x0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"Failed to open file ",pFile);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_88._0_8_ = *plVar3;
    ppuVar5 = (uint **)(plVar3 + 2);
    if ((uint **)local_88._0_8_ == ppuVar5) {
      local_78 = *ppuVar5;
      pcStack_70 = (char *)plVar3[3];
      local_88._0_8_ = &local_78;
    }
    else {
      local_78 = *ppuVar5;
    }
    local_88._8_8_ = plVar3[1];
    *plVar3 = (long)ppuVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::runtime_error::runtime_error(prVar4,(string *)local_88);
    *(undefined ***)prVar4 = &PTR__runtime_error_0081d260;
    __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar2 = (**(code **)(*plVar3 + 0x30))(plVar3);
  if (uVar2 < 0x10) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_88._0_8_ = &local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"XFile is too small.","");
    std::runtime_error::runtime_error(prVar4,(string *)local_88);
    *(undefined ***)prVar4 = &PTR__runtime_error_0081d260;
    __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = &this->mBuffer;
  std::vector<char,_std::allocator<char>_>::resize(this_00,uVar2 + 1);
  (**(code **)(*plVar3 + 0x10))
            (plVar3,(this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_start,1,uVar2);
  BaseImporter::ConvertToUTF8(this_00);
  XFileParser::XFileParser((XFileParser *)local_88,this_00);
  CreateDataRepresentationFromImport(this,pScene,local_58);
  if (pScene->mRootNode != (aiNode *)0x0) {
    XFileParser::~XFileParser((XFileParser *)local_88);
    (**(code **)(*plVar3 + 8))(plVar3);
    return;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"XFile is ill-formatted - no content imported.","");
  std::runtime_error::runtime_error(prVar4,(string *)&local_50);
  *(undefined ***)prVar4 = &PTR__runtime_error_0081d260;
  __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void XFileImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    // read file into memory
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));
    if ( file.get() == NULL ) {
        throw DeadlyImportError( "Failed to open file " + pFile + "." );
    }

    static const size_t MinSize = 16;
    size_t fileSize = file->FileSize();
    if ( fileSize < MinSize ) {
        throw DeadlyImportError( "XFile is too small." );
    }

    // in the hope that binary files will never start with a BOM ...
    mBuffer.resize( fileSize + 1);
    file->Read( &mBuffer.front(), 1, fileSize);
    ConvertToUTF8(mBuffer);

    // parse the file into a temporary representation
    XFileParser parser( mBuffer);

    // and create the proper return structures out of it
    CreateDataRepresentationFromImport( pScene, parser.GetImportedData());

    // if nothing came from it, report it as error
    if ( !pScene->mRootNode ) {
        throw DeadlyImportError( "XFile is ill-formatted - no content imported." );
    }
}